

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::MultisampleShadeCountRenderCase::verifyImage
          (MultisampleShadeCountRenderCase *this,Surface *resultImage)

{
  ostringstream *poVar1;
  RenderTarget RVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  TestLog *pTVar5;
  _Base_ptr p_Var6;
  _Rb_tree_color _Var7;
  RenderTarget *pRVar8;
  mapped_type_conflict *pmVar9;
  _Rb_tree_node_base *p_Var10;
  ConstPixelBufferAccess *access;
  void *__buf;
  _Base_ptr p_Var11;
  int iVar12;
  _Rb_tree_header *p_Var13;
  int y;
  int iVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  void *data;
  int x;
  int iVar17;
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  shadeFrequency;
  deUint32 packed;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_2e0;
  TextureFormat local_2b0;
  string local_2a8;
  string local_288;
  ConstPixelBufferAccess local_268;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  RVar2 = (this->super_MultisampleRenderCase).m_renderTarget;
  iVar12 = 2;
  if (((RVar2 == TARGET_DEFAULT) || ((this->super_MultisampleRenderCase).m_numRequestedSamples != 0)
      ) && ((RVar2 != TARGET_DEFAULT ||
            (pRVar8 = Context::getRenderTarget
                                ((this->super_MultisampleRenderCase).super_TestCase.m_context),
            1 < pRVar8->m_numSamples)))) {
    iVar12 = (this->super_MultisampleRenderCase).m_numTargetSamples + 1;
  }
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e0._M_impl.super__Rb_tree_header._M_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar5 = ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"ResultImage","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Result Image","");
  local_2b0.order = RGBA;
  local_2b0.type = UNORM_INT8;
  data = (void *)(resultImage->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (resultImage->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_268,&local_2b0,resultImage->m_width,resultImage->m_height,1,data);
  access = &local_268;
  tcu::LogImage::LogImage(&local_240,&local_288,&local_2a8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_240,(int)pTVar5,__buf,(size_t)access);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying image has (at least) ",0x1f);
  std::ostream::operator<<(poVar1,iVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," different shades.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
             ,0x58);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
    operator_delete(local_240.m_description._M_dataplus._M_p,
                    local_240.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
    operator_delete(local_240.m_name._M_dataplus._M_p,
                    local_240.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  iVar14 = 0;
  do {
    iVar17 = 0;
    do {
      p_Var13 = &local_2e0._M_impl.super__Rb_tree_header;
      _Var7 = *(_Rb_tree_color *)
               ((long)(resultImage->m_pixels).m_ptr +
               (long)(resultImage->m_width * iVar14 + iVar17) * 4);
      _Var7 = (_Var7 & 0xff00) << 8 | _Var7 & 0xffff;
      local_1b0._0_4_ = _Var7;
      if (iVar17 != iVar14) {
        p_Var6 = local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var16 = &p_Var13->_M_header;
        if (local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          do {
            p_Var15 = p_Var16;
            p_Var11 = p_Var6;
            _Var3 = p_Var11[1]._M_color;
            p_Var16 = p_Var11;
            if (_Var3 < _Var7) {
              p_Var16 = p_Var15;
            }
            p_Var6 = (&p_Var11->_M_left)[_Var3 < _Var7];
          } while ((&p_Var11->_M_left)[_Var3 < _Var7] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var16 != p_Var13) {
            if (_Var3 < _Var7) {
              p_Var11 = p_Var15;
            }
            if (p_Var11[1]._M_color <= _Var7) {
              pmVar9 = std::
                       map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                       ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                     *)&local_2e0,(key_type *)local_1b0);
              iVar4 = *pmVar9;
              pmVar9 = std::
                       map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                       ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                     *)&local_2e0,(key_type *)local_1b0);
              *pmVar9 = iVar4 + 1;
              goto LAB_0144b31f;
            }
          }
        }
        pmVar9 = std::
                 map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                               *)&local_2e0,(key_type *)local_1b0);
        *pmVar9 = 1;
      }
LAB_0144b31f:
      iVar17 = iVar17 + 1;
    } while (iVar17 != 0x80);
    iVar14 = iVar14 + 1;
    if (iVar14 == 0x80) {
      iVar14 = 0;
      for (p_Var10 = local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &local_2e0._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        iVar14 = iVar14 + (uint)(*(int *)&p_Var10[1].field_0x4 < 100);
      }
      local_1b0._0_8_ =
           ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Found ",6);
      std::ostream::operator<<(poVar1,(int)local_2e0._M_impl.super__Rb_tree_header._M_node_count);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," different shades.\n",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tRare (less than ",0x11);
      std::ostream::operator<<(poVar1,100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," pixels): ",10);
      std::ostream::operator<<(poVar1,iVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tCommon: ",9);
      std::ostream::operator<<
                (poVar1,(int)local_2e0._M_impl.super__Rb_tree_header._M_node_count - iVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      iVar14 = (int)local_2e0._M_impl.super__Rb_tree_header._M_node_count;
      if ((int)local_2e0._M_impl.super__Rb_tree_header._M_node_count < iVar12) {
        local_1b0._0_8_ =
             ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Image verification failed.",0x1a);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
      ::~_Rb_tree(&local_2e0);
      return iVar12 <= iVar14;
    }
  } while( true );
}

Assistant:

bool MultisampleShadeCountRenderCase::verifyImage (const tcu::Surface& resultImage)
{
	const bool				isSingleSampleTarget	= (m_renderTarget != TARGET_DEFAULT && m_numRequestedSamples == 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1);
	const int				numShadesRequired		= (isSingleSampleTarget) ? (2) : (m_numTargetSamples + 1);
	const int				rareThreshold			= 100;
	int						rareCount				= 0;
	std::map<deUint32, int>	shadeFrequency;

	m_testCtx.getLog()
		<< tcu::TestLog::Image("ResultImage", "Result Image", resultImage.getAccess())
		<< tcu::TestLog::Message
		<< "Verifying image has (at least) " << numShadesRequired << " different shades.\n"
		<< "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
		<< tcu::TestLog::EndMessage;

	for (int y = 0; y < RENDER_SIZE; ++y)
	for (int x = 0; x < RENDER_SIZE; ++x)
	{
		const tcu::RGBA	color	= resultImage.getPixel(x, y);
		const deUint32	packed	= ((deUint32)color.getRed()) + ((deUint32)color.getGreen() << 8) + ((deUint32)color.getGreen() << 16);

		// on the triangle edge, skip
		if (x == y)
			continue;

		if (shadeFrequency.find(packed) == shadeFrequency.end())
			shadeFrequency[packed] = 1;
		else
			shadeFrequency[packed] = shadeFrequency[packed] + 1;
	}

	for (std::map<deUint32, int>::const_iterator it = shadeFrequency.begin(); it != shadeFrequency.end(); ++it)
		if (it->second < rareThreshold)
			rareCount++;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Found " << (int)shadeFrequency.size() << " different shades.\n"
		<< "\tRare (less than " << rareThreshold << " pixels): " << rareCount << "\n"
		<< "\tCommon: " << (int)shadeFrequency.size() - rareCount << "\n"
		<< tcu::TestLog::EndMessage;

	if ((int)shadeFrequency.size() < numShadesRequired)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}